

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int loadStatTbl(sqlite3 *db,int bStat3,char *zSql1,char *zSql2,char *zDb)

{
  uint uVar1;
  sqlite3_stmt *psVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  uchar *puVar8;
  Index *pIVar9;
  IndexSample *pIVar10;
  void *__dest;
  void *__src;
  long lVar11;
  long lVar12;
  void **ppvVar13;
  void **ppvVar14;
  long lVar15;
  ulong uVar16;
  sqlite3_stmt *pStmt;
  Index *local_50;
  int local_44;
  sqlite3_stmt *local_40;
  sqlite3 *local_38;
  
  pStmt = (sqlite3_stmt *)0x0;
  pcVar7 = sqlite3MPrintf(db,zSql1,zDb);
  if (pcVar7 == (char *)0x0) {
    return 7;
  }
  iVar4 = sqlite3_prepare(db,pcVar7,-1,&pStmt,(char **)0x0);
  sqlite3DbFreeNN(db,pcVar7);
  psVar2 = pStmt;
  local_50 = (Index *)zSql2;
  local_44 = bStat3;
  local_38 = db;
  if (iVar4 != 0) {
    return iVar4;
  }
  while (iVar4 = sqlite3_step(psVar2), iVar4 == 100) {
    puVar8 = sqlite3_column_text(psVar2,0);
    if (puVar8 != (uchar *)0x0) {
      uVar5 = sqlite3_column_int(psVar2,1);
      pIVar9 = findIndexOrPrimaryKey(db,(char *)puVar8,zDb);
      if ((pIVar9 != (Index *)0x0) && (pIVar9->nSample == 0)) {
        uVar3 = 1;
        if (local_44 == 0) {
          if (((pIVar9->pTable->tabFlags & 0x20) == 0) ||
             ((*(ushort *)&pIVar9->field_0x63 & 3) != 2)) {
            uVar3 = pIVar9->nColumn;
          }
          else {
            uVar3 = pIVar9->nKeyCol;
          }
        }
        uVar16 = (ulong)uVar3;
        pIVar9->nSampleCol = (uint)uVar3;
        pIVar10 = (IndexSample *)
                  sqlite3DbMallocZero(local_38,(long)(int)(((uint)uVar3 * 0xc + 0x28) * uVar5 +
                                                          (uint)uVar3 * 4));
        pIVar9->aSample = pIVar10;
        if (pIVar10 == (IndexSample *)0x0) goto LAB_0014b053;
        pIVar9->aAvgEq = (tRowcnt *)(pIVar10 + (int)uVar5);
        uVar1 = uVar5;
        if ((int)uVar5 < 1) {
          uVar1 = 0;
        }
        lVar11 = (long)&pIVar10[(int)uVar5].p + uVar16 * 4;
        lVar12 = uVar16 * 0xc;
        ppvVar13 = &pIVar10[(int)uVar5].p;
        ppvVar14 = &pIVar10[(int)uVar5].p + uVar16;
        for (lVar15 = 0; ppvVar13 = (void **)((long)ppvVar13 + lVar12), db = local_38,
            (ulong)uVar1 * 0x28 - lVar15 != 0; lVar15 = lVar15 + 0x28) {
          *(long *)((long)&pIVar10->anEq + lVar15) = lVar11;
          *(void ***)((long)&pIVar10->anLt + lVar15) = ppvVar14;
          *(void ***)((long)&pIVar10->anDLt + lVar15) = ppvVar13;
          lVar11 = lVar11 + lVar12;
          ppvVar14 = (void **)((long)ppvVar14 + lVar12);
        }
      }
    }
  }
  iVar4 = sqlite3_finalize(psVar2);
  if (iVar4 != 0) {
    return iVar4;
  }
  pcVar7 = sqlite3MPrintf(db,(char *)local_50,zDb);
  if (pcVar7 != (char *)0x0) {
    iVar4 = sqlite3_prepare(db,pcVar7,-1,&pStmt,(char **)0x0);
    sqlite3DbFreeNN(db,pcVar7);
    if (iVar4 != 0) {
      return iVar4;
    }
    local_50 = (Index *)0x0;
    iVar4 = local_44;
    psVar2 = pStmt;
    while( true ) {
      do {
        iVar6 = sqlite3_step(psVar2);
        if (iVar6 != 100) {
          iVar4 = sqlite3_finalize(psVar2);
          if (iVar4 != 0) {
            return iVar4;
          }
          initAvgEq(local_50);
          return 0;
        }
        puVar8 = sqlite3_column_text(psVar2,0);
      } while (((puVar8 == (uchar *)0x0) ||
               (pIVar9 = findIndexOrPrimaryKey(db,(char *)puVar8,zDb), pIVar9 == (Index *)0x0)) ||
              ((iVar6 = pIVar9->nSampleCol, iVar4 != 0 && (1 < iVar6))));
      if (pIVar9 != local_50) {
        initAvgEq(local_50);
        local_50 = pIVar9;
      }
      pIVar10 = pIVar9->aSample;
      iVar4 = pIVar9->nSample;
      local_40 = pStmt;
      puVar8 = sqlite3_column_text(pStmt,1);
      decodeIntArray((char *)puVar8,iVar6,pIVar10[iVar4].anEq,(LogEst *)0x0,(Index *)0x0);
      puVar8 = sqlite3_column_text(local_40,2);
      decodeIntArray((char *)puVar8,iVar6,pIVar10[iVar4].anLt,(LogEst *)0x0,(Index *)0x0);
      local_40 = pStmt;
      puVar8 = sqlite3_column_text(pStmt,3);
      decodeIntArray((char *)puVar8,iVar6,pIVar10[iVar4].anDLt,(LogEst *)0x0,(Index *)0x0);
      iVar6 = sqlite3_column_bytes(local_40,4);
      pIVar10[iVar4].n = iVar6;
      __dest = sqlite3DbMallocZero(db,(long)(iVar6 + 2));
      pIVar10[iVar4].p = __dest;
      if (__dest == (void *)0x0) break;
      if (pIVar10[iVar4].n != 0) {
        __src = sqlite3_column_blob(pStmt,4);
        memcpy(__dest,__src,(long)pIVar10[iVar4].n);
      }
      pIVar9->nSample = pIVar9->nSample + 1;
      iVar4 = local_44;
      psVar2 = pStmt;
    }
LAB_0014b053:
    sqlite3_finalize(pStmt);
  }
  return 7;
}

Assistant:

static int loadStatTbl(
  sqlite3 *db,                  /* Database handle */
  int bStat3,                   /* Assume single column records only */
  const char *zSql1,            /* SQL statement 1 (see above) */
  const char *zSql2,            /* SQL statement 2 (see above) */
  const char *zDb               /* Database name (e.g. "main") */
){
  int rc;                       /* Result codes from subroutines */
  sqlite3_stmt *pStmt = 0;      /* An SQL statement being run */
  char *zSql;                   /* Text of the SQL statement */
  Index *pPrevIdx = 0;          /* Previous index in the loop */
  IndexSample *pSample;         /* A slot in pIdx->aSample[] */

  assert( db->lookaside.bDisable );
  zSql = sqlite3MPrintf(db, zSql1, zDb);
  if( !zSql ){
    return SQLITE_NOMEM_BKPT;
  }
  rc = sqlite3_prepare(db, zSql, -1, &pStmt, 0);
  sqlite3DbFree(db, zSql);
  if( rc ) return rc;

  while( sqlite3_step(pStmt)==SQLITE_ROW ){
    int nIdxCol = 1;              /* Number of columns in stat4 records */

    char *zIndex;   /* Index name */
    Index *pIdx;    /* Pointer to the index object */
    int nSample;    /* Number of samples */
    int nByte;      /* Bytes of space required */
    int i;          /* Bytes of space required */
    tRowcnt *pSpace;

    zIndex = (char *)sqlite3_column_text(pStmt, 0);
    if( zIndex==0 ) continue;
    nSample = sqlite3_column_int(pStmt, 1);
    pIdx = findIndexOrPrimaryKey(db, zIndex, zDb);
    assert( pIdx==0 || bStat3 || pIdx->nSample==0 );
    /* Index.nSample is non-zero at this point if data has already been
    ** loaded from the stat4 table. In this case ignore stat3 data.  */
    if( pIdx==0 || pIdx->nSample ) continue;
    if( bStat3==0 ){
      assert( !HasRowid(pIdx->pTable) || pIdx->nColumn==pIdx->nKeyCol+1 );
      if( !HasRowid(pIdx->pTable) && IsPrimaryKeyIndex(pIdx) ){
        nIdxCol = pIdx->nKeyCol;
      }else{
        nIdxCol = pIdx->nColumn;
      }
    }
    pIdx->nSampleCol = nIdxCol;
    nByte = sizeof(IndexSample) * nSample;
    nByte += sizeof(tRowcnt) * nIdxCol * 3 * nSample;
    nByte += nIdxCol * sizeof(tRowcnt);     /* Space for Index.aAvgEq[] */

    pIdx->aSample = sqlite3DbMallocZero(db, nByte);
    if( pIdx->aSample==0 ){
      sqlite3_finalize(pStmt);
      return SQLITE_NOMEM_BKPT;
    }
    pSpace = (tRowcnt*)&pIdx->aSample[nSample];
    pIdx->aAvgEq = pSpace; pSpace += nIdxCol;
    for(i=0; i<nSample; i++){
      pIdx->aSample[i].anEq = pSpace; pSpace += nIdxCol;
      pIdx->aSample[i].anLt = pSpace; pSpace += nIdxCol;
      pIdx->aSample[i].anDLt = pSpace; pSpace += nIdxCol;
    }
    assert( ((u8*)pSpace)-nByte==(u8*)(pIdx->aSample) );
  }
  rc = sqlite3_finalize(pStmt);
  if( rc ) return rc;

  zSql = sqlite3MPrintf(db, zSql2, zDb);
  if( !zSql ){
    return SQLITE_NOMEM_BKPT;
  }
  rc = sqlite3_prepare(db, zSql, -1, &pStmt, 0);
  sqlite3DbFree(db, zSql);
  if( rc ) return rc;

  while( sqlite3_step(pStmt)==SQLITE_ROW ){
    char *zIndex;                 /* Index name */
    Index *pIdx;                  /* Pointer to the index object */
    int nCol = 1;                 /* Number of columns in index */

    zIndex = (char *)sqlite3_column_text(pStmt, 0);
    if( zIndex==0 ) continue;
    pIdx = findIndexOrPrimaryKey(db, zIndex, zDb);
    if( pIdx==0 ) continue;
    /* This next condition is true if data has already been loaded from 
    ** the sqlite_stat4 table. In this case ignore stat3 data.  */
    nCol = pIdx->nSampleCol;
    if( bStat3 && nCol>1 ) continue;
    if( pIdx!=pPrevIdx ){
      initAvgEq(pPrevIdx);
      pPrevIdx = pIdx;
    }
    pSample = &pIdx->aSample[pIdx->nSample];
    decodeIntArray((char*)sqlite3_column_text(pStmt,1),nCol,pSample->anEq,0,0);
    decodeIntArray((char*)sqlite3_column_text(pStmt,2),nCol,pSample->anLt,0,0);
    decodeIntArray((char*)sqlite3_column_text(pStmt,3),nCol,pSample->anDLt,0,0);

    /* Take a copy of the sample. Add two 0x00 bytes the end of the buffer.
    ** This is in case the sample record is corrupted. In that case, the
    ** sqlite3VdbeRecordCompare() may read up to two varints past the
    ** end of the allocated buffer before it realizes it is dealing with
    ** a corrupt record. Adding the two 0x00 bytes prevents this from causing
    ** a buffer overread.  */
    pSample->n = sqlite3_column_bytes(pStmt, 4);
    pSample->p = sqlite3DbMallocZero(db, pSample->n + 2);
    if( pSample->p==0 ){
      sqlite3_finalize(pStmt);
      return SQLITE_NOMEM_BKPT;
    }
    if( pSample->n ){
      memcpy(pSample->p, sqlite3_column_blob(pStmt, 4), pSample->n);
    }
    pIdx->nSample++;
  }
  rc = sqlite3_finalize(pStmt);
  if( rc==SQLITE_OK ) initAvgEq(pPrevIdx);
  return rc;
}